

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mix.cpp
# Opt level: O0

void Timidity::mix_single_signal
               (SDWORD control_ratio,sample_t *sp,float *lp,Voice *v,float *ampat,int count)

{
  int iVar1;
  int local_3c;
  float local_38;
  int cc;
  final_volume_t amp;
  int count_local;
  float *ampat_local;
  Voice *v_local;
  float *lp_local;
  sample_t *sp_local;
  SDWORD control_ratio_local;
  
  local_3c = v->control_counter;
  if ((local_3c != 0) || (iVar1 = update_signal(v), local_3c = control_ratio, iVar1 == 0)) {
    local_38 = *ampat;
    cc = count;
    v_local = (Voice *)lp;
    lp_local = sp;
    while (cc != 0) {
      if (cc <= local_3c) {
        v->control_counter = local_3c - cc;
        while (cc != 0) {
          *(float *)v_local = *lp_local * local_38 + *(float *)v_local;
          v_local = (Voice *)&v_local->sample;
          cc = cc + -1;
          lp_local = lp_local + 1;
        }
        return;
      }
      cc = cc - local_3c;
      while (local_3c != 0) {
        *(float *)v_local = *lp_local * local_38 + *(float *)v_local;
        v_local = (Voice *)&v_local->sample;
        local_3c = local_3c + -1;
        lp_local = lp_local + 1;
      }
      iVar1 = update_signal(v);
      if (iVar1 != 0) {
        return;
      }
      local_38 = *ampat;
      local_3c = control_ratio;
    }
  }
  return;
}

Assistant:

static void mix_single_signal(SDWORD control_ratio, const sample_t *sp, float *lp, Voice *v, float *ampat, int count)
{
	final_volume_t amp;
	int cc;

	if (0 == (cc = v->control_counter))
	{
		cc = control_ratio;
		if (update_signal(v))
			return;		/* Envelope ran out */
	}
	amp = *ampat;

	while (count)
	{
		if (cc < count)
		{
			count -= cc;
			while (cc--)
			{
				lp[0] += *sp++ * amp;
				lp += 2;
			}
			cc = control_ratio;
			if (update_signal(v))
				return;	/* Envelope ran out */
			amp = *ampat;
		}
		else
		{
			v->control_counter = cc - count;
			while (count--)
			{
				lp[0] += *sp++ * amp;
				lp += 2;
			}
			return;
		}
	}
}